

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::_prove_no_clique(HomomorphismModel *this,uint g,int p,int tt)

{
  Proof *pPVar1;
  size_t sVar2;
  unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  _Base_ptr p_Var7;
  ProofError *this_00;
  int w_1;
  int iVar8;
  int w;
  ulong uVar9;
  ulong uVar10;
  int count;
  ulong local_250;
  InputGraph gv_1;
  vector<int,_std::allocator<int>_> invinclude;
  vector<int,_std::allocator<int>_> include;
  InputGraph gv;
  undefined1 local_1e8 [40];
  CliqueResult result;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  p_clique;
  CliqueParams params;
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  t_clique_neighbourhood;
  
  t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_header;
  p_clique.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_clique.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p_clique.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,0xffffffff);
  t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       t_clique_neighbourhood._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::vector
            (&include,(ulong)this->pattern_size,(value_type_conflict1 *)&params,
             (allocator_type *)&result);
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
       0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&invinclude,(ulong)this->pattern_size,(value_type_conflict1 *)&params,
             (allocator_type *)&result);
  local_250 = (ulong)(uint)tt;
  iVar8 = 0;
  for (uVar9 = 0; (long)uVar9 < (long)(int)this->pattern_size; uVar9 = uVar9 + 1) {
    if ((uint)p != uVar9) {
      bVar4 = SVOBitset::test((SVOBitset *)
                              ((ulong)(this->max_graphs * (int)uVar9 + g) * 0x88 +
                              *(long *)&(((this->_imp)._M_t.
                                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                          .
                                          super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                         ._M_head_impl)->pattern_graph_rows).
                                        super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                              ),p);
      if (bVar4) {
        include.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = iVar8;
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar6] = (int)uVar9;
      }
    }
  }
  InputGraph::InputGraph(&gv,iVar8,false,false);
  uVar5 = this->pattern_size;
  for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
    if (include.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] != -1) {
      for (uVar10 = 0; uVar10 < uVar5; uVar10 = uVar10 + 1) {
        if ((uVar9 != uVar10) &&
           (include.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10] != -1)) {
          bVar4 = SVOBitset::test((SVOBitset *)
                                  ((ulong)(this->max_graphs * (int)uVar9 + g) * 0x88 +
                                  *(long *)&(((this->_imp)._M_t.
                                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              .
                                              super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                             ._M_head_impl)->pattern_graph_rows).
                                            super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                  ),(int)uVar10);
          if (bVar4) {
            InputGraph::add_edge
                      (&gv,include.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar9],
                       include.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10]);
          }
        }
        uVar5 = this->pattern_size;
      }
    }
  }
  params.decide.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  params.stop_after_finding.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  params.restarts_schedule._M_t.
  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t.
  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
  super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl =
       (__uniq_ptr_data<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>,_true,_true>
        )(__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)0x0;
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.start_time.__d.__r = (duration)0;
  params.nogood_size_limit = 0xffffffff;
  params.colour_class_order = SingletonsFirst;
  params.input_order = false;
  params.connected.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  params.connected.super__Function_base._M_functor._8_8_ = 0;
  params.connected.super__Function_base._M_manager = (_Manager_type)0x0;
  params.connected._M_invoker = (_Invoker_type)0x0;
  params.proof_options.super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
  super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
  super__Optional_payload_base<gss::ProofOptions>._M_engaged = false;
  params.adjust_objective_for_mcs.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  params.extend_proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.extend_proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.proof_is_for_hom = false;
  std::__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)&params,
             (__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->_imp)._M_t.
              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
             params);
  params.start_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::make_unique<gss::NoRestartsSchedule>();
  uVar3 = params.restarts_schedule;
  params.restarts_schedule._M_t.
  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t.
  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
  super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl =
       (__uniq_ptr_data<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>,_true,_true>
        )(__uniq_ptr_data<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>,_true,_true>
          )result.clique._M_t._M_impl._0_8_;
  result.clique._M_t._M_impl._0_8_ = 0;
  if ((__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)
      uVar3._M_t.
      super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t
      .super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
      super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)0x0) {
    (**(code **)(*(long *)uVar3._M_t.
                          super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                          .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl + 8))
              ();
  }
  std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
  ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_> *)
              &result);
  solve_clique_problem(&result,&gv,&params);
  for (p_Var7 = result.clique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar2 = result.clique._M_t._M_impl.super__Rb_tree_header._M_node_count,
      (_Rb_tree_header *)p_Var7 != &result.clique._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    pattern_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)local_1e8,this,
               invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color]);
    std::
    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
    ::emplace_back<std::pair<int,std::__cxx11::string>>
              ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                *)&p_clique,(NamedVertex *)local_1e8);
    std::__cxx11::string::~string((string *)(local_1e8 + 8));
  }
  CliqueResult::~CliqueResult(&result);
  CliqueParams::~CliqueParams(&params);
  InputGraph::~InputGraph(&gv);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&invinclude.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&include.super__Vector_base<int,_std::allocator<int>_>);
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            (&invinclude,(ulong)this->target_size,(value_type_conflict1 *)&params,
             (allocator_type *)&result);
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
       0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gv,(ulong)this->target_size,
             (value_type_conflict1 *)&params,(allocator_type *)&result);
  count = 0;
  for (uVar9 = 0; (long)uVar9 < (long)(int)this->target_size; uVar9 = uVar9 + 1) {
    if (local_250 != uVar9) {
      iVar8 = (int)uVar9;
      bVar4 = SVOBitset::test((SVOBitset *)
                              ((ulong)(this->max_graphs * iVar8 + g) * 0x88 +
                              *(long *)&(((this->_imp)._M_t.
                                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                          .
                                          super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                         ._M_head_impl)->target_graph_rows).
                                        super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                              ),(int)local_250);
      if (bVar4) {
        target_vertex_for_proof_abi_cxx11_((NamedVertex *)&params,this,iVar8);
        std::
        _Rb_tree<int,std::pair<int_const,std::pair<int,std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::pair<int,std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<int,std::__cxx11::string>>>>
        ::_M_emplace_unique<int&,std::pair<int,std::__cxx11::string>>
                  ((_Rb_tree<int,std::pair<int_const,std::pair<int,std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::pair<int,std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<int,std::__cxx11::string>>>>
                    *)&t_clique_neighbourhood,&count,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&params);
        std::__cxx11::string::~string
                  ((string *)
                   &params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = count;
        *(int *)((long)gv._imp._M_t.
                       super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                       .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl +
                (long)count * 4) = iVar8;
        count = count + 1;
      }
    }
  }
  pPVar1 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&params,this,p);
  target_vertex_for_proof_abi_cxx11_((NamedVertex *)&result,this,tt);
  Proof::prepare_hom_clique_proof(pPVar1,(NamedVertex *)&params,(NamedVertex *)&result,(uint)sVar2);
  local_250 = sVar2;
  std::__cxx11::string::~string((string *)&result.clique._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::~string
            ((string *)
             &params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  InputGraph::InputGraph(&gv_1,count,false,false);
  uVar5 = this->target_size;
  for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
    if (invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] != -1) {
      for (uVar10 = 0; uVar10 < uVar5; uVar10 = uVar10 + 1) {
        if ((uVar9 != uVar10) &&
           (invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar10] != -1)) {
          bVar4 = SVOBitset::test((SVOBitset *)
                                  ((ulong)(this->max_graphs * (int)uVar9 + g) * 0x88 +
                                  *(long *)&(((this->_imp)._M_t.
                                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              .
                                              super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                             ._M_head_impl)->target_graph_rows).
                                            super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                  ),(int)uVar10);
          if (bVar4) {
            InputGraph::add_edge
                      (&gv_1,invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar9],
                       invinclude.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10]);
          }
          else if (uVar9 < uVar10) {
            pPVar1 = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&params,this,p);
            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&result,this,tt);
            target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1e8,this,(int)uVar9);
            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&include,this,(int)uVar10);
            Proof::add_hom_clique_non_edge
                      (pPVar1,(NamedVertex *)&params,(NamedVertex *)&result,&p_clique,
                       (NamedVertex *)local_1e8,(NamedVertex *)&include);
            std::__cxx11::string::~string
                      ((string *)
                       &include.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            std::__cxx11::string::~string((string *)(local_1e8 + 8));
            std::__cxx11::string::~string
                      ((string *)&result.clique._M_t._M_impl.super__Rb_tree_header);
            std::__cxx11::string::~string
                      ((string *)
                       &params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
        uVar5 = this->target_size;
      }
    }
  }
  pPVar1 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&params,this,p);
  target_vertex_for_proof_abi_cxx11_((NamedVertex *)&result,this,tt);
  uVar9 = local_250;
  Proof::start_hom_clique_proof
            (pPVar1,(NamedVertex *)&params,&p_clique,(NamedVertex *)&result,&t_clique_neighbourhood)
  ;
  std::__cxx11::string::~string((string *)&result.clique._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::~string
            ((string *)
             &params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  params.decide.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  params.stop_after_finding.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  params.restarts_schedule._M_t.
  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t.
  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
  super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl =
       (__uniq_ptr_data<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>,_true,_true>
        )(__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)0x0;
  params.start_time.__d.__r = (duration)0;
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.timeout.super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.nogood_size_limit = 0xffffffff;
  params.colour_class_order = SingletonsFirst;
  params.input_order = false;
  params.connected.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  params.connected.super__Function_base._M_functor._8_8_ = 0;
  params.connected.super__Function_base._M_manager = (_Manager_type)0x0;
  params.connected._M_invoker = (_Invoker_type)0x0;
  params.proof_options.super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
  super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
  super__Optional_payload_base<gss::ProofOptions>._M_engaged = false;
  params.adjust_objective_for_mcs.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  params.extend_proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.extend_proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.proof_is_for_hom = false;
  std::__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)&params,
             (__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->_imp)._M_t.
              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
             params);
  params.start_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  params.decide.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(sVar2 & 0xffffffff | 0x100000000);
  std::make_unique<gss::NoRestartsSchedule>();
  uVar3 = params.restarts_schedule;
  params.restarts_schedule._M_t.
  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t.
  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
  super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl =
       (__uniq_ptr_data<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>,_true,_true>
        )(__uniq_ptr_data<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>,_true,_true>
          )result.clique._M_t._M_impl._0_8_;
  result.clique._M_t._M_impl._0_8_ = 0;
  if ((__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)
      uVar3._M_t.
      super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>._M_t
      .super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
      super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>)0x0) {
    (**(code **)(*(long *)uVar3._M_t.
                          super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                          .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl + 8))
              ();
  }
  std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
  ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_> *)
              &result);
  std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&params.extend_proof.
              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
             &(((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
              ->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
  params.proof_is_for_hom = true;
  solve_clique_problem(&result,&gv_1,&params);
  if ((result.complete == true) &&
     (result.clique._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    this_00 = (ProofError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,"Oops, found a clique that shound\'t exist",
               (allocator<char> *)&include);
    ProofError::ProofError(this_00,(string *)local_1e8);
    __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
  }
  pPVar1 = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
           proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1e8,this,p);
  target_vertex_for_proof_abi_cxx11_((NamedVertex *)&include,this,tt);
  Proof::finish_hom_clique_proof
            (pPVar1,(NamedVertex *)local_1e8,(NamedVertex *)&include,(uint)uVar9);
  std::__cxx11::string::~string
            ((string *)
             &include.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  CliqueResult::~CliqueResult(&result);
  CliqueParams::~CliqueParams(&params);
  InputGraph::~InputGraph(&gv_1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&gv);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&invinclude.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Rb_tree(&t_clique_neighbourhood._M_t);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&p_clique);
  return;
}

Assistant:

auto HomomorphismModel::_prove_no_clique(
    unsigned g,
    int p,
    int tt) const -> void
{
    vector<NamedVertex> p_clique;
    map<int, NamedVertex> t_clique_neighbourhood;
    unsigned decide_size;

    {
        vector<int> include(pattern_size, -1), invinclude(pattern_size, 0);
        int count = 0;
        for (int w = 0; w < int(pattern_size); ++w)
            if (w != p && _imp->pattern_graph_rows[w * max_graphs + g].test(p)) {
                include[w] = count;
                invinclude[count] = w;
                ++count;
            }

        InputGraph gv(count, false, false);
        for (unsigned f = 0; f < pattern_size; ++f)
            if (include[f] != -1)
                for (unsigned t = 0; t < pattern_size; ++t)
                    if (f != t && include[t] != -1 && _imp->pattern_graph_rows[f * max_graphs + g].test(t))
                        gv.add_edge(include[f], include[t]);

        CliqueParams params;
        params.timeout = _imp->params.timeout;
        params.start_time = steady_clock::now();
        params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto result = solve_clique_problem(gv, params);
        for (auto & v : result.clique)
            p_clique.push_back(pattern_vertex_for_proof(invinclude[v]));
        decide_size = result.clique.size();
    }

    {
        vector<int> include(target_size, -1), invinclude(target_size, 0);
        int count = 0;
        for (int w = 0; w < int(target_size); ++w)
            if (w != tt && _imp->target_graph_rows[w * max_graphs + g].test(tt)) {
                t_clique_neighbourhood.emplace(count, target_vertex_for_proof(w));
                include[w] = count;
                invinclude[count] = w;
                ++count;
            }

        _imp->proof->prepare_hom_clique_proof(pattern_vertex_for_proof(p), target_vertex_for_proof(tt), decide_size);

        InputGraph gv(count, false, false);
        for (unsigned f = 0; f < target_size; ++f)
            if (include[f] != -1)
                for (unsigned t = 0; t < target_size; ++t) {
                    if (f != t && include[t] != -1) {
                        if (_imp->target_graph_rows[f * max_graphs + g].test(t))
                            gv.add_edge(include[f], include[t]);
                        else if (f < t)
                            _imp->proof->add_hom_clique_non_edge(
                                pattern_vertex_for_proof(p), target_vertex_for_proof(tt),
                                p_clique, target_vertex_for_proof(f), target_vertex_for_proof(t));
                    }
                }

        _imp->proof->start_hom_clique_proof(pattern_vertex_for_proof(p), move(p_clique), target_vertex_for_proof(tt), move(t_clique_neighbourhood));

        CliqueParams params;
        params.timeout = _imp->params.timeout;
        params.start_time = steady_clock::now();
        params.decide = make_optional(decide_size);
        params.restarts_schedule = make_unique<NoRestartsSchedule>();
        params.extend_proof = _imp->proof;
        params.proof_is_for_hom = true;

        auto result = solve_clique_problem(gv, params);
        if (result.complete && ! result.clique.empty())
            throw ProofError{"Oops, found a clique that shound't exist"};
        _imp->proof->finish_hom_clique_proof(pattern_vertex_for_proof(p), target_vertex_for_proof(tt), decide_size);
    }
}